

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  char cVar4;
  uint32_t uVar5;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false> __it
  ;
  long *plVar9;
  long *plVar10;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *local_30;
  key_type local_28;
  
  uVar5 = Random::upTo((Random *)(*(long *)((long)this + 0xe8) + 0x10),10);
  if (uVar5 == 0) {
    cVar4 = wasm::Type::isDefaultable();
    if ((cVar4 != '\0') && (cVar4 = wasm::EHUtils::containsValidDanglingPop(curr), cVar4 == '\0')) {
      vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
      if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_start ==
          (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x30d,
                      "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                     );
      }
      ppEVar6 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)(*(long *)((long)this + 0xe8) + 0x10),vec);
      local_48 = 0;
      uStack_40 = 0;
      local_30 = std::
                 _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
                 ::_M_manager;
      local_28 = (key_type)wasm::ExpressionManipulator::flexibleCopy(*ppEVar6);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,3);
      }
      lVar1 = *(long *)((long)this + 200);
      if ((lVar1 != 0) && (*(long *)(lVar1 + 0xf8) != 0)) {
        uVar2 = **this;
        uVar8 = uVar2 % *(ulong *)(lVar1 + 0xe8);
        plVar9 = *(long **)(*(long *)(lVar1 + 0xe0) + uVar8 * 8);
        plVar10 = (long *)0x0;
        if ((plVar9 != (long *)0x0) &&
           (plVar3 = (long *)*plVar9, plVar10 = plVar9, uVar2 != ((long *)*plVar9)[1])) {
          while (plVar9 = plVar3, plVar3 = (long *)*plVar9, plVar3 != (long *)0x0) {
            plVar10 = (long *)0x0;
            if (((ulong)plVar3[1] % *(ulong *)(lVar1 + 0xe8) != uVar8) ||
               (plVar10 = plVar9, uVar2 == plVar3[1])) goto LAB_00131197;
          }
          plVar10 = (long *)0x0;
        }
LAB_00131197:
        if (plVar10 == (long *)0x0) {
          __it._M_cur = (__node_type *)0x0;
        }
        else {
          __it._M_cur = (__node_type *)*plVar10;
        }
        if (__it._M_cur != (__node_type *)0x0) {
          uStack_40 = CONCAT44(uStack_40._4_4_,*(undefined4 *)((long)__it._M_cur + 0x18));
          local_48 = *(undefined8 *)((long)__it._M_cur + 0x10);
          std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(lVar1 + 0xe0),(const_iterator)__it._M_cur);
          pmVar7 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(lVar1 + 0xe0),&local_28);
          pmVar7->fileIndex = (undefined4)local_48;
          pmVar7->lineNumber = local_48._4_4_;
          pmVar7->columnNumber = (BinaryLocation)uStack_40;
        }
      }
      **this = local_28;
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }